

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

ImportElems * __thiscall
jsonnet::internal::SortImports::extractImportElems
          (ImportElems *__return_storage_ptr__,SortImports *this,Binds *binds,Fodder *after)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  pointer pBVar5;
  Fodder adjacent;
  Fodder beforeNext;
  Fodder before;
  Bind newBind;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_168;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_148;
  SortImports *local_128;
  Fodder *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_118;
  undefined8 local_108;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_f8;
  undefined1 local_e0 [32];
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_c0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_98;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_80;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_60;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<jsonnet::internal::SortImports::ImportElem,_std::allocator<jsonnet::internal::SortImports::ImportElem>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128 = this;
  local_120 = after;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&local_f8,
         &((binds->
           super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
           )._M_impl.super__Vector_impl_data._M_start)->varFodder);
  pBVar5 = (binds->
           super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = ((long)(binds->
                 super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5 >> 4) *
          0x2e8ba2e8ba2e8ba3;
  if (0 < (int)lVar2) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      local_168.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108 = 0;
      local_118._M_allocated_capacity = 0;
      local_118._8_8_ = 0;
      if (uVar3 == (int)lVar2 - 1) {
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&local_168,local_120);
      }
      else {
        splitFodder((pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                     *)local_e0,local_128,
                    (Fodder *)
                    ((long)&pBVar5[1].varFodder.
                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            ._M_impl + lVar4));
        local_148._M_dataplus._M_p = (pointer)&local_118;
        local_148._M_string_length = (size_type)&local_168;
        std::
        tuple<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
        ::operator=((tuple<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                     *)&local_148,
                    (pair<std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                     *)local_e0);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)(local_e0 + 0x18));
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)local_e0);
      }
      if ((local_168.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_168.
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (local_168.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].kind == INTERSTITIAL)) {
        local_148._M_dataplus._M_p = (pointer)0x0;
        local_148._M_string_length = 0;
        local_148.field_2._M_allocated_capacity = 0;
        FodderElement::FodderElement
                  ((FodderElement *)local_e0,LINE_END,0,0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_148);
        fodder_push_back(&local_168,(FodderElement *)local_e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_e0 + 0x10));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_148);
      }
      Local::Bind::Bind((Bind *)local_e0,
                        (Bind *)((long)&(pBVar5->varFodder).
                                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        ._M_impl + lVar4));
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)local_e0,&local_f8);
      lVar2 = *(long *)((long)&pBVar5->body + lVar4);
      if (lVar2 == 0) {
LAB_001a8bc5:
        __assert_fail("import != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                      ,0x88e,
                      "ImportElems jsonnet::internal::SortImports::extractImportElems(const Local::Binds &, Fodder)"
                     );
      }
      lVar2 = __dynamic_cast(lVar2,&AST::typeinfo,&Import::typeinfo,0);
      if (lVar2 == 0) goto LAB_001a8bc5;
      lVar1 = *(long *)(*(long *)(lVar2 + 0x80) + 0x80);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::u32string::_M_construct<char32_t*>
                ((u32string *)&local_148,lVar1,lVar1 + *(long *)(*(long *)(lVar2 + 0x80) + 0x88) * 4
                );
      std::
      vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>
      ::
      emplace_back<std::__cxx11::u32string,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Local::Bind&>
                ((vector<jsonnet::internal::SortImports::ImportElem,std::allocator<jsonnet::internal::SortImports::ImportElem>>
                  *)__return_storage_ptr__,&local_148,&local_168,(Bind *)local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity * 4 + 4);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      operator=(&local_f8,
                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)&local_118);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_48);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_60);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector(&local_80);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_98);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_c0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)local_e0);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&local_118);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&local_168);
      uVar3 = uVar3 + 1;
      pBVar5 = (binds->
               super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = ((long)(binds->
                     super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5 >> 4) *
              0x2e8ba2e8ba2e8ba3;
      lVar4 = lVar4 + 0xb0;
    } while ((long)uVar3 < (long)(int)lVar2);
  }
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  ~vector(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

ImportElems extractImportElems(const Local::Binds &binds, Fodder after)
    {
        ImportElems result;
        Fodder before = binds.front().varFodder;
        for (int i = 0; i < int(binds.size()); ++i) {
            const auto &bind = binds[i];
            bool last = i == int(binds.size() - 1);
            Fodder adjacent, beforeNext;
            if (!last) {
                auto &next = binds[i + 1];
                std::tie(adjacent, beforeNext) = splitFodder(next.varFodder);
            } else {
                adjacent = after;
            }
            ensureCleanNewline(adjacent);
            Local::Bind newBind = bind;
            newBind.varFodder = before;
            Import *import = dynamic_cast<Import *>(bind.body);
            assert(import != nullptr);
            result.emplace_back(sortingKey(import), adjacent, newBind);
            before = beforeNext;
        }
        return result;
    }